

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsItemClicked(int mouse_button)

{
  float fVar1;
  bool bVar2;
  
  if (4 < (uint)mouse_button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x1164,"bool ImGui::IsMouseClicked(int, bool)");
  }
  fVar1 = (GImGui->IO).MouseDownDuration[(uint)mouse_button];
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    bVar2 = IsItemHovered(0);
    return bVar2;
  }
  return false;
}

Assistant:

bool ImGui::IsMouseClicked(int button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicPressedRepeatAmount(t, t - g.IO.DeltaTime, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.5f);
        if (amount > 0)
            return true;
    }

    return false;
}